

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::addSubDeviceInfo
          (CLIntercept *this,cl_device_id parentDevice,cl_device_id *devices,cl_uint numSubDevices)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  mutex *__mutex;
  float __x;
  cl_device_id device;
  cl_device_id local_38;
  
  __mutex = &this->m_Mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar5 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  if (numSubDevices != 0) {
    p_Var1 = &(this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      numSubDevices = numSubDevices - 1;
      local_38 = devices[numSubDevices];
      if (local_38 != (cl_device_id)0x0) {
        pmVar3 = std::
                 map<_cl_device_id_*,_CLIntercept::SSubDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SSubDeviceInfo>_>_>
                 ::operator[](&this->m_SubDeviceInfoMap,&local_38);
        pmVar3->ParentDevice = parentDevice;
        pmVar3->SubDeviceIndex = numSubDevices;
        p_Var4 = (this->m_DeviceInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = &p_Var1->_M_header;
        if (p_Var4 != (_Base_ptr)0x0) {
          do {
            if (*(cl_device_id *)(p_Var4 + 1) >= local_38) {
              p_Var6 = p_Var4;
            }
            p_Var4 = (&p_Var4->_M_left)[*(cl_device_id *)(p_Var4 + 1) < local_38];
          } while (p_Var4 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
             ((cl_device_id)((_Rb_tree_header *)p_Var6)->_M_node_count <= local_38)) {
            logf(this,__x);
          }
        }
      }
    } while (numSubDevices != 0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CLIntercept::addSubDeviceInfo(
    const cl_device_id parentDevice,
    const cl_device_id* devices,
    cl_uint numSubDevices )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    while( numSubDevices-- )
    {
        cl_device_id    device = devices[ numSubDevices ];
        if( device )
        {
            SSubDeviceInfo& subDeviceInfo = m_SubDeviceInfoMap[ device ];

            subDeviceInfo.ParentDevice = parentDevice;
            subDeviceInfo.SubDeviceIndex = numSubDevices;

            // Currently, information about a device is assumed to be
            // invariant, though for sub-device handles the information
            // about a device can change if sub-device handles are recycled.
            // Since this is expected to occur rarely, for now simply log a
            // warning if this occurs.
            if( m_DeviceInfoMap.find(device) != m_DeviceInfoMap.end() )
            {
                logf( "Warning: found a recycled sub-device handle %p!\n",
                    device );
            }
        }
    }
}